

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsHasProperty(JsValueRef object,JsPropertyIdRef propertyId,bool *hasProperty)

{
  int iVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  JavascriptLibrary *pJVar4;
  bool bVar5;
  BOOL BVar6;
  JsErrorCode JVar7;
  RecyclableObject *this;
  undefined4 *puVar8;
  JsrtContext *pJVar9;
  ScriptContext *__localScriptContext;
  Type TVar10;
  void *unaff_retaddr;
  undefined1 auStack_e8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  TTDRecorder local_a8;
  undefined1 local_90 [8];
  EnterScriptObject __enterScriptObject;
  undefined1 local_50 [8];
  JsPropertyIdRef propertyId_local;
  bool *hasProperty_local;
  JsValueRef object_local;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (object == (JsValueRef)0x0) {
    JVar7 = JsErrorInvalidArgument;
  }
  else {
    local_50 = (undefined1  [8])propertyId;
    propertyId_local = hasProperty;
    hasProperty_local = (bool *)object;
    BVar6 = Js::JavascriptOperators::IsObject(object);
    if (BVar6 == 0) {
      return JsErrorArgumentNotObject;
    }
    this = Js::VarTo<Js::RecyclableObject>(hasProperty_local);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                         ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00376a1f;
      *puVar8 = 0;
    }
    TVar10 = ((this->type).ptr)->typeId;
    if ((0x57 < (int)TVar10) && (BVar6 = Js::RecyclableObject::IsExternal(this), BVar6 == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                         ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                         "GetTypeId aValue has invalid TypeId");
      if (!bVar5) goto LAB_00376a1f;
      *puVar8 = 0;
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    while (TVar10 != TypeIds_Null) {
      if (TVar10 == TypeIds_Proxy) {
        __enterScriptObject.library = (JavascriptLibrary *)local_50;
        local_a8.m_actionEvent = (EventLogEntry *)0x0;
        local_a8.m_resultPtr = (TTDVar *)0x0;
        pJVar9 = JsrtContext::GetCurrent();
        JVar7 = JsErrorNoCurrentContext;
        if (pJVar9 != (JsrtContext *)0x0) {
          pSVar2 = (((pJVar9->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
                   ptr;
          AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                    ((AutoNestedHandledExceptionType *)((long)&object_local + 4),
                     ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
          __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
          __entryExitRecord.scriptContext = (ScriptContext *)0x0;
          __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
          __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
          auStack_e8 = (undefined1  [8])0x0;
          __entryExitRecord._0_1_ = 0;
          __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
          __entryExitRecord._2_6_ = 0;
          __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
          Js::EnterScriptObject::EnterScriptObject
                    ((EnterScriptObject *)local_90,pSVar2,(ScriptEntryExitRecord *)auStack_e8,
                     unaff_retaddr,&stack0x00000000,true,true,true);
          Js::ScriptContext::OnScriptStart(pSVar2,true,true);
          Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_90);
          JVar7 = JsHasProperty::anon_class_24_3_132321e7::operator()
                            ((anon_class_24_3_132321e7 *)&__enterScriptObject.library,pSVar2,
                             &local_a8);
          Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_90);
          if (((JVar7 & 0x6ffff) == JsErrorOutOfMemory) ||
             ((((JVar7 - JsErrorNoCurrentContext < 7 &&
                ((0x43U >> (JVar7 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) ||
               (JVar7 == JsErrorFatal)) || (JVar7 == JsErrorScriptTerminated)))) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar8 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                               ,0xcc,
                               "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                               ,
                               "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                              );
            if (!bVar5) goto LAB_00376a1f;
            *puVar8 = 0;
          }
          AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                    ((AutoNestedHandledExceptionType *)((long)&object_local + 4));
        }
        if ((JavascriptLibrary *)local_a8.m_actionEvent == (JavascriptLibrary *)0x0) {
          return JVar7;
        }
        iVar1 = *(int *)((long)&(((JavascriptLibraryBase *)&(local_a8.m_actionEvent)->EventKind)->
                                super_FinalizableObject).super_IRecyclerVisitedObject.
                                _vptr_IRecyclerVisitedObject + 4);
        pJVar4 = (JavascriptLibrary *)local_a8.m_actionEvent;
        goto joined_r0x00376375;
      }
      this = Js::RecyclableObject::GetPrototype(this);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar5) goto LAB_00376a1f;
        *puVar8 = 0;
      }
      TVar10 = ((this->type).ptr)->typeId;
      if ((0x57 < (int)TVar10) && (BVar6 = Js::RecyclableObject::IsExternal(this), BVar6 == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                           "GetTypeId aValue has invalid TypeId");
        if (!bVar5) goto LAB_00376a1f;
        *puVar8 = 0;
      }
    }
    local_90 = (undefined1  [8])local_50;
    __enterScriptObject.entryExitRecord = (ScriptEntryExitRecord *)&hasProperty_local;
    __enterScriptObject._8_8_ = &propertyId_local;
    __enterScriptObject.library = (JavascriptLibrary *)0x0;
    pJVar9 = JsrtContext::GetCurrent();
    JVar7 = JsErrorNoCurrentContext;
    if (pJVar9 != (JsrtContext *)0x0) {
      pSVar2 = (((pJVar9->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)auStack_e8,
                 ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      JVar7 = JsHasProperty::anon_class_24_3_132321e7::operator()
                        ((anon_class_24_3_132321e7 *)local_90,pSVar2,
                         (TTDRecorder *)&__enterScriptObject.library);
      if (((JVar7 - JsErrorNoCurrentContext < 7) &&
          ((0x43U >> (JVar7 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) ||
         ((JVar7 == JsErrorOutOfMemory ||
          ((JVar7 == JsErrorFatal || ((JVar7 & 0xfffffffd) == JsErrorScriptException)))))) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                           ,0x11f,
                           "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated)"
                           ,
                           "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated"
                          );
        if (!bVar5) {
LAB_00376a1f:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar8 = 0;
      }
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)auStack_e8);
    }
    if (__enterScriptObject.library != (JavascriptLibrary *)0x0) {
      iVar1 = *(int *)((long)&((__enterScriptObject.library)->super_JavascriptLibraryBase).
                              super_FinalizableObject.super_IRecyclerVisitedObject.
                              _vptr_IRecyclerVisitedObject + 4);
      pJVar4 = __enterScriptObject.library;
joined_r0x00376375:
      if (iVar1 != -1) {
        TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
      }
      *(JsErrorCode *)
       ((long)&(pJVar4->super_JavascriptLibraryBase).super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4) = JVar7;
    }
  }
  return JVar7;
}

Assistant:

CHAKRA_API JsHasProperty(_In_ JsValueRef object, _In_ JsPropertyIdRef propertyId, _Out_ bool *hasProperty)
{
    VALIDATE_JSREF(object);
    if (!Js::JavascriptOperators::IsObject(object)) return JsErrorArgumentNotObject;

    auto internalHasProperty = [&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTHasProperty, (Js::PropertyRecord *)propertyId, object);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_PROPERTYID(propertyId);
        PARAM_NOT_NULL(hasProperty);
        *hasProperty = false;

        Js::RecyclableObject * instance = Js::VarTo<Js::RecyclableObject>(object);
        *hasProperty = Js::JavascriptOperators::HasProperty(instance, ((Js::PropertyRecord *)propertyId)->GetPropertyId()) != 0;

        return JsNoError;
    };

    Js::RecyclableObject* robject = Js::VarTo<Js::RecyclableObject>(object);
    Js::TypeId typeId = Js::JavascriptOperators::GetTypeId(robject);
    while (typeId != Js::TypeIds_Null && typeId != Js::TypeIds_Proxy)
    {
        robject = robject->GetPrototype();
        typeId = Js::JavascriptOperators::GetTypeId(robject);
    }

    if (typeId == Js::TypeIds_Proxy)
    {
        return ContextAPIWrapper<JSRT_MAYBE_TRUE>(internalHasProperty);
    }
#ifdef _CHAKRACOREBUILD
    else if (typeId == Js::TypeIds_Object)
    {
        // CEOs can also have traps so we would want the Enter/Leave semantics for those.
        Js::CustomExternalWrapperObject * externalWrapper = Js::JavascriptOperators::TryFromVar<Js::CustomExternalWrapperObject>(object);
        if (externalWrapper)
        {
            return ContextAPIWrapper<JSRT_MAYBE_TRUE>(internalHasProperty);
        }
    }
#endif

    return ContextAPINoScriptWrapper(internalHasProperty);
}